

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

int decompress_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  jpeg_d_coef_controller *pjVar2;
  inverse_DCT_method_ptr p_Var3;
  int iVar4;
  uint uVar5;
  JBLOCKARRAY ppaJVar6;
  uint uVar7;
  ulong uVar8;
  JBLOCKROW paJVar9;
  long lVar10;
  JSAMPARRAY ppJVar11;
  JDIMENSION JVar12;
  jpeg_component_info *pjVar13;
  ulong local_68;
  
  pjVar2 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  while ((cinfo->input_scan_number < cinfo->output_scan_number ||
         ((cinfo->input_scan_number == cinfo->output_scan_number &&
          (cinfo->input_iMCU_row <= cinfo->output_iMCU_row))))) {
    iVar4 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar4 == 0) {
      return 0;
    }
  }
  if (0 < cinfo->num_components) {
    pjVar13 = cinfo->comp_info;
    lVar10 = 0;
    do {
      if (pjVar13->component_needed != 0) {
        ppaJVar6 = (*cinfo->mem->access_virt_barray)
                             ((j_common_ptr)cinfo,
                              (jvirt_barray_ptr)(&pjVar2[3].decompress_data)[lVar10],
                              cinfo->output_iMCU_row * pjVar13->v_samp_factor,pjVar13->v_samp_factor
                              ,0);
        if (cinfo->output_iMCU_row < JVar1 - 1) {
          uVar5 = pjVar13->v_samp_factor;
        }
        else {
          uVar5 = pjVar13->height_in_blocks % (uint)pjVar13->v_samp_factor;
          if (uVar5 == 0) {
            uVar5 = pjVar13->v_samp_factor;
          }
        }
        if (0 < (int)uVar5) {
          p_Var3 = cinfo->idct->inverse_DCT[lVar10];
          ppJVar11 = output_buf[lVar10];
          local_68 = 0;
          do {
            uVar7 = cinfo->master->first_MCU_col[lVar10];
            uVar8 = (ulong)uVar7;
            if (uVar7 <= cinfo->master->last_MCU_col[lVar10]) {
              paJVar9 = ppaJVar6[local_68] + uVar8;
              JVar12 = 0;
              do {
                (*p_Var3)(cinfo,pjVar13,*paJVar9,ppJVar11,JVar12);
                paJVar9 = paJVar9 + 1;
                JVar12 = JVar12 + pjVar13->DCT_scaled_size;
                uVar7 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar7;
              } while (uVar7 <= cinfo->master->last_MCU_col[lVar10]);
            }
            ppJVar11 = ppJVar11 + pjVar13->DCT_scaled_size;
            local_68 = local_68 + 1;
          } while (local_68 != uVar5);
        }
      }
      lVar10 = lVar10 + 1;
      pjVar13 = pjVar13 + 1;
    } while (lVar10 < cinfo->num_components);
  }
  uVar5 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar5;
  return 4 - (uint)(uVar5 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_data(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num;
  int ci, block_row, block_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number < cinfo->output_scan_number ||
         (cinfo->input_scan_number == cinfo->output_scan_number &&
          cinfo->input_iMCU_row <= cinfo->output_iMCU_row)) {
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (!compptr->component_needed)
      continue;
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[ci],
       cinfo->output_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, FALSE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row] + cinfo->master->first_MCU_col[ci];
      output_col = 0;
      for (block_num = cinfo->master->first_MCU_col[ci];
           block_num <= cinfo->master->last_MCU_col[ci]; block_num++) {
        (*inverse_DCT) (cinfo, compptr, (JCOEFPTR)buffer_ptr, output_ptr,
                        output_col);
        buffer_ptr++;
        output_col += compptr->_DCT_scaled_size;
      }
      output_ptr += compptr->_DCT_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}